

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  cmTarget *pcVar1;
  size_type sVar2;
  bool bVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  size_type __n;
  int iVar5;
  int iVar6;
  PolicyStatus PVar7;
  char *pcVar8;
  ostream *poVar9;
  cmake *pcVar10;
  cmListFileBacktrace *r;
  _Rb_tree_node_base *p_Var11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  cmGeneratorTarget *pcVar13;
  PolicyID id;
  pointer item;
  pointer item_00;
  cmTargetLinkLibraryType cVar14;
  bool bVar15;
  cmStringRange cVar16;
  cmBacktraceRange cVar17;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmGeneratorExpressionDAGChecker dagChecker;
  ostringstream e;
  MessageType local_35c;
  auto_ptr<cmCompiledGeneratorExpression> local_358;
  const_iterator local_350;
  cmOptionalLinkImplementation *local_348;
  string local_340;
  cmListFileBacktrace *local_320;
  string local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string local_2e0;
  string local_2c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2a0;
  string *local_298;
  const_iterator local_290;
  cmGeneratorTarget *local_288;
  PolicyMap *local_280;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_278;
  undefined1 local_270 [16];
  undefined1 local_260 [24];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_228;
  cmListFileBacktrace local_1f0;
  undefined1 local_1c8 [32];
  cmGeneratorTarget *local_1a8;
  cmListFileBacktrace local_1a0 [2];
  ios_base local_158 [264];
  cmListFileBacktrace local_50;
  
  local_348 = impl;
  local_288 = head;
  cVar16 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar17 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_320 = (cmListFileBacktrace *)cVar17.Begin._M_current;
  if (cVar16.Begin._M_current._M_current != cVar16.End._M_current._M_current) {
    local_280 = &this->PolicyMap;
    local_278 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_2a0 = &this->MaxLanguageStandards;
    local_298 = config;
    do {
      local_290 = cVar16.End._M_current;
      local_350 = cVar16.Begin._M_current;
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8._24_6_ = 0x534549524152;
      local_1c8[0x10] = 'L';
      local_1c8._17_5_ = 0x4c5f4b4e49;
      local_1c8._22_2_ = 0x4249;
      local_1c8._8_8_ = 0xe;
      local_1c8[0x1e] = '\0';
      local_1c8._0_8_ = (cmCompiledGeneratorExpression *)(local_1c8 + 0x10);
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_270,&this->Target->Name,
                 (string *)local_1c8,(GeneratorExpressionContent *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      if ((cmCompiledGeneratorExpression *)local_1c8._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,
                        CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10])) + 1);
      }
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&local_2c0,local_320);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1c8,&local_2c0);
      local_358.x_ = (cmCompiledGeneratorExpression *)local_1c8._0_8_;
      local_1c8._0_8_ = (pointer)0x0;
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_1c8);
      local_1c8._0_8_ = local_1c8 + 0x10;
      local_1c8._8_8_ = 0;
      local_1c8[0x10] = '\0';
      pcVar8 = cmCompiledGeneratorExpression::Evaluate
                         (local_358.x_,this->LocalGenerator,config,false,local_288,
                          (cmGeneratorExpressionDAGChecker *)local_270,(string *)local_1c8);
      std::__cxx11::string::string((string *)&local_2e0,pcVar8,(allocator *)&local_318);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,
                        CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10])) + 1);
      }
      cmSystemTools::ExpandListArgument(&local_2e0,&local_2f8,false);
      if ((local_358.x_)->HadHeadSensitiveCondition == true) {
        local_348->HadHeadSensitiveCondition = true;
      }
      item = local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          CheckCMP0004(&local_318,this,item);
          __n = local_318._M_string_length;
          pcVar1 = this->Target;
          sVar2 = (pcVar1->Name)._M_string_length;
          if (local_318._M_string_length == sVar2) {
            if ((local_318._M_string_length == 0) ||
               (iVar5 = bcmp(local_318._M_dataplus._M_p,(pcVar1->Name)._M_dataplus._M_p,
                             local_318._M_string_length), iVar5 == 0)) goto LAB_00425ae9;
LAB_00425bb1:
            pcVar13 = FindTargetToLink(this,&local_318);
            bVar15 = true;
            if (local_2e0._M_string_length == (local_350._M_current)->_M_string_length) {
              if (local_2e0._M_string_length == 0) {
                bVar15 = false;
              }
              else {
                iVar5 = bcmp(local_2e0._M_dataplus._M_p,((local_350._M_current)->_M_dataplus)._M_p,
                             local_2e0._M_string_length);
                bVar15 = iVar5 != 0;
              }
            }
            cmLinkImplItem::cmLinkImplItem
                      ((cmLinkImplItem *)local_1c8,&local_318,pcVar13,local_320,bVar15);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
            emplace_back<cmLinkImplItem>
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_348,
                       (cmLinkImplItem *)local_1c8);
            cmListFileBacktrace::~cmListFileBacktrace(local_1a0);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,
                              CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10]))
                              + 1);
            }
            iVar5 = 0;
          }
          else {
            if (local_318._M_string_length != 0) goto LAB_00425bb1;
LAB_00425ae9:
            iVar5 = 7;
            if ((__n == sVar2) &&
               ((__n == 0 ||
                (iVar6 = bcmp(local_318._M_dataplus._M_p,(pcVar1->Name)._M_dataplus._M_p,__n),
                iVar6 == 0)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              PVar7 = cmPolicies::PolicyMap::Get(local_280,CMP0038);
              if (PVar7 == OLD) {
                local_35c = FATAL_ERROR;
                bVar3 = true;
                bVar15 = true;
              }
              else {
                if (PVar7 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x26,id);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1c8,local_340._M_dataplus._M_p,
                                      local_340._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._M_dataplus._M_p != &local_340.field_2) {
                    operator_delete(local_340._M_dataplus._M_p,
                                    local_340.field_2._M_allocated_capacity + 1);
                  }
                  bVar3 = false;
                  local_35c = AUTHOR_WARNING;
                }
                else {
                  local_35c = FATAL_ERROR;
                  bVar3 = true;
                }
                bVar15 = false;
              }
              if (!bVar15) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,"Target \"",8);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1c8,(this->Target->Name)._M_dataplus._M_p,
                                    (this->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\" links to itself.",0x12);
                pcVar10 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
                std::__cxx11::stringbuf::str();
                r = cmTarget::GetBacktrace(this->Target);
                cmListFileBacktrace::cmListFileBacktrace(&local_50,r);
                cmake::IssueMessage(pcVar10,local_35c,&local_340,&local_50);
                cmListFileBacktrace::~cmListFileBacktrace(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p,
                                  local_340.field_2._M_allocated_capacity + 1);
                }
                if (bVar3) {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                  std::ios_base::~ios_base(local_158);
                  iVar5 = 1;
                  goto LAB_00425c5c;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base(local_158);
            }
          }
LAB_00425c5c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_00425ddb;
          item = item + 1;
        } while (item != local_2f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar5 = 5;
LAB_00425ddb:
      if (iVar5 == 5) {
        psVar4 = &(local_358.x_)->SeenTargetProperties;
        for (p_Var11 = ((local_358.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var11 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          pcVar8 = GetProperty(this,(string *)(p_Var11 + 1));
          if (pcVar8 == (char *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_278,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
          }
        }
        iVar5 = 0;
        cmCompiledGeneratorExpression::GetMaxLanguageStandard(local_358.x_,this,local_2a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_358);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_2c0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1f0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_228);
      config = local_298;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_270._8_8_ != local_260 + 8) {
        operator_delete((void *)local_270._8_8_,local_260._8_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2f8);
      if (iVar5 != 0) {
        return;
      }
      local_320 = local_320 + 1;
      cVar16.End._M_current = local_290._M_current;
      cVar16.Begin._M_current = local_350._M_current + 1;
    } while (local_350._M_current + 1 != local_290._M_current);
  }
  local_290 = cVar16.End._M_current;
  local_350 = cVar16.Begin._M_current;
  pcVar10 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2c0,pcVar10);
  if (config->_M_string_length == 0) {
    cVar14 = OPTIMIZED_LibraryType;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_1c8,config);
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (local_2c0._M_dataplus._M_p,local_2c0._M_string_length,local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,
                      CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10])) + 1);
    }
    cVar14 = (_Var12._M_current ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2c0._M_string_length) + DEBUG_LibraryType;
  }
  pcVar1 = this->Target;
  item_00 = (pcVar1->OriginalLinkLibraries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (item_00 !=
      (pcVar1->OriginalLinkLibraries).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_348 = (cmOptionalLinkImplementation *)
                &(local_348->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item_00->second != GENERAL_LibraryType) && (item_00->second != cVar14)) {
        CheckCMP0004((string *)local_270,this,&item_00->first);
        if ((pointer)local_270._8_8_ == (pointer)(this->Target->Name)._M_string_length) {
          if (((pointer)local_270._8_8_ != (pointer)0x0) &&
             (iVar5 = bcmp((void *)local_270._0_8_,(this->Target->Name)._M_dataplus._M_p,
                           local_270._8_8_), iVar5 != 0)) {
LAB_00426047:
            pcVar13 = FindTargetToLink(this,(string *)local_270);
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,local_270._0_8_,
                       (pointer)(local_270._8_8_ + local_270._0_8_));
            local_1a8 = pcVar13;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_348,
                       (cmLinkItem *)local_1c8);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,
                              CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10]))
                              + 1);
            }
          }
        }
        else if ((pointer)local_270._8_8_ != (pointer)0x0) goto LAB_00426047;
        if ((cmGeneratorExpressionDAGChecker *)local_270._0_8_ !=
            (cmGeneratorExpressionDAGChecker *)(local_270 + 0x10)) {
          operator_delete((void *)local_270._0_8_,local_260._0_8_ + 1);
        }
      }
      item_00 = item_00 + 1;
    } while (item_00 !=
             (pcVar1->OriginalLinkLibraries).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange = this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange = this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
                                     end = entryRange.end();
       le != end; ++le, ++btIt) {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
      this->GetName(), "LINK_LIBRARIES", CM_NULLPTR, CM_NULLPTR);
    cmGeneratorExpression ge(*btIt);
    CM_AUTO_PTR<cmCompiledGeneratorExpression> const cge = ge.Parse(*le);
    std::string const evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }

    for (std::vector<std::string>::const_iterator li = llibs.begin();
         li != llibs.end(); ++li) {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(*li);
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(cmLinkImplItem(
        name, this->FindTargetToLink(name), *btIt, evaluated != *le));
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
         it != seenProps.end(); ++it) {
      if (!this->GetProperty(*it)) {
        this->LinkImplicitNullProperties.insert(*it);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
       li != oldllibs.end(); ++li) {
    if (li->second != GENERAL_LibraryType && li->second != linkType) {
      std::string name = this->CheckCMP0004(li->first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, this->FindTargetToLink(name)));
    }
  }
}